

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_event_reader.hpp
# Opt level: O2

void __thiscall
jsoncons::msgpack::
msgpack_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::read_to
          (msgpack_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
          ,basic_item_event_visitor<char> *visitor,error_code *ec)

{
  basic_item_event_receiver<char> *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ser_context *context;
  
  iVar1 = (*(this->super_basic_staj_event_reader<char>)._vptr_basic_staj_event_reader[4])();
  if ((~*(byte *)CONCAT44(extraout_var,iVar1) & 0xc) != 0) {
    basic_item_event_receiver<char>::dump
              (&this->cursor_visitor_,visitor,
               (ser_context *)
               ((long)&(this->super_basic_staj_event_reader<char>)._vptr_basic_staj_event_reader +
               (long)(this->super_basic_staj_event_reader<char>)._vptr_basic_staj_event_reader[-3]),
               ec);
    return;
  }
  (this->parser_).cursor_mode_ = false;
  (this->parser_).mark_level_ =
       (int)(((long)(this->parser_).state_stack_.
                    super__Vector_base<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->parser_).state_stack_.
                   super__Vector_base<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  this_00 = &this->cursor_visitor_;
  basic_item_event_receiver<char>::dump
            (this_00,visitor,
             (ser_context *)
             ((long)&(this->super_basic_staj_event_reader<char>)._vptr_basic_staj_event_reader +
             (long)(this->super_basic_staj_event_reader<char>)._vptr_basic_staj_event_reader[-3]),ec
            );
  if (ec->_M_value == 0) {
    read_next(this,visitor,ec);
    (this->parser_).cursor_mode_ = true;
    (this->parser_).mark_level_ = 0;
    iVar1 = (*(this->super_basic_staj_event_reader<char>)._vptr_basic_staj_event_reader[4])(this);
    context = (ser_context *)
              ((long)&(this->super_basic_staj_event_reader<char>)._vptr_basic_staj_event_reader +
              (long)(this->super_basic_staj_event_reader<char>)._vptr_basic_staj_event_reader[-3]);
    if (*(char *)CONCAT44(extraout_var_00,iVar1) == '\r') {
      basic_item_event_visitor<char>::end_object
                (&this_00->super_basic_item_event_visitor<char>,context);
      return;
    }
    basic_item_event_visitor<char>::end_array
              (&this_00->super_basic_item_event_visitor<char>,context);
    return;
  }
  return;
}

Assistant:

void read_to(basic_item_event_visitor<char_type>& visitor,
            std::error_code& ec) override
        {
            if (is_begin_container(current().event_type()))
            {
                parser_.cursor_mode(false);
                parser_.mark_level(parser_.level());
                cursor_visitor_.dump(visitor, *this, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                read_next(visitor, ec);
                parser_.cursor_mode(true);
                parser_.mark_level(0);
                if (current().event_type() == staj_event_type::begin_object)
                {
                    cursor_visitor_.end_object(*this);
                }
                else
                {
                    cursor_visitor_.end_array(*this);
                }
            }
            else
            {
                cursor_visitor_.dump(visitor, *this, ec);
            }
        }